

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHessianUtils.cpp
# Opt level: O0

HighsStatus extractTriangularHessian(HighsOptions *options,HighsHessian *hessian)

{
  value_type vVar1;
  int iVar2;
  int iVar3;
  value_type vVar4;
  int iVar5;
  reference pvVar6;
  reference pvVar7;
  int *in_RSI;
  long in_RDI;
  HighsInt num_ignored_nz;
  HighsInt iRow;
  HighsInt iEl;
  HighsInt nnz0;
  HighsInt iCol;
  HighsInt nnz;
  HighsInt dim;
  HighsStatus return_status;
  int local_28;
  int local_20;
  int local_1c;
  HighsStatus local_14;
  
  local_14 = kOk;
  iVar2 = *in_RSI;
  local_1c = 0;
  for (local_20 = 0; iVar5 = local_1c, local_20 < iVar2; local_20 = local_20 + 1) {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)local_20);
    for (local_28 = *pvVar6;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)(local_20 + 1)),
        local_28 < *pvVar6; local_28 = local_28 + 1) {
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)local_28);
      iVar3 = *pvVar6;
      if (local_20 <= iVar3) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)local_1c);
        *pvVar6 = iVar3;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xe),(long)local_28
                           );
        vVar1 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xe),(long)local_1c
                           );
        *pvVar7 = vVar1;
        if ((iVar3 == local_20) && (iVar5 < local_1c)) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)iVar5);
          vVar4 = *pvVar6;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)local_1c);
          *pvVar6 = vVar4;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xe),(long)iVar5)
          ;
          vVar1 = *pvVar7;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xe),
                              (long)local_1c);
          *pvVar7 = vVar1;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RSI + 8),(long)iVar5);
          *pvVar6 = iVar3;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xe),
                              (long)local_28);
          vVar1 = *pvVar7;
          pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RSI + 0xe),(long)iVar5)
          ;
          *pvVar7 = vVar1;
        }
        local_1c = local_1c + 1;
      }
    }
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)local_20);
    *pvVar6 = iVar5;
  }
  pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)iVar2);
  if (*pvVar6 - local_1c != 0) {
    iVar5 = in_RSI[1];
    if (iVar5 == 1) {
      highsLogUser((HighsLogOptions *)(in_RDI + 0x380),kWarning,
                   "Ignored %d entries of Hessian in opposite triangle\n",
                   (ulong)(uint)(*pvVar6 - local_1c));
    }
    local_14 = (HighsStatus)(iVar5 == 1);
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RSI + 2),(long)iVar2);
    *pvVar6 = local_1c;
  }
  in_RSI[1] = 1;
  return local_14;
}

Assistant:

HighsStatus extractTriangularHessian(const HighsOptions& options,
                                     HighsHessian& hessian) {
  // Viewing the Hessian column-wise, remove any entries in the strict
  // upper triangle
  HighsStatus return_status = HighsStatus::kOk;
  const HighsInt dim = hessian.dim_;
  HighsInt nnz = 0;
  for (HighsInt iCol = 0; iCol < dim; iCol++) {
    const HighsInt nnz0 = nnz;
    for (HighsInt iEl = hessian.start_[iCol]; iEl < hessian.start_[iCol + 1];
         iEl++) {
      HighsInt iRow = hessian.index_[iEl];
      if (iRow < iCol) continue;
      hessian.index_[nnz] = iRow;
      hessian.value_[nnz] = hessian.value_[iEl];
      if (iRow == iCol && nnz > nnz0) {
        // Diagonal entry is not first in column so swap it in
        hessian.index_[nnz] = hessian.index_[nnz0];
        hessian.value_[nnz] = hessian.value_[nnz0];
        hessian.index_[nnz0] = iRow;
        hessian.value_[nnz0] = hessian.value_[iEl];
      }
      nnz++;
    }
    hessian.start_[iCol] = nnz0;
  }
  const HighsInt num_ignored_nz = hessian.start_[dim] - nnz;
  assert(num_ignored_nz >= 0);
  if (num_ignored_nz) {
    if (hessian.format_ == HessianFormat::kTriangular) {
      highsLogUser(options.log_options, HighsLogType::kWarning,
                   "Ignored %" HIGHSINT_FORMAT
                   " entries of Hessian in opposite triangle\n",
                   num_ignored_nz);
      return_status = HighsStatus::kWarning;
    }
    hessian.start_[dim] = nnz;
  }
  assert(hessian.start_[dim] == nnz);
  hessian.format_ = HessianFormat::kTriangular;
  return return_status;
}